

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O2

void av1_visit_palette(AV1Decoder *pbi,MACROBLOCKD *xd,aom_reader *r,palette_visitor_fn_t visit)

{
  int plane;
  ulong uVar1;
  
  if ((((*xd->mi)->field_0xa7 & 0x80) == 0) && ((*xd->mi)->ref_frame[0] < '\x01')) {
    for (uVar1 = 0; uVar1 < (ulong)(((pbi->common).seq_params)->monochrome == '\0') + 1;
        uVar1 = uVar1 + 1) {
      if (((uVar1 == 0) || (xd->is_chroma_ref == true)) &&
         (((*xd->mi)->palette_mode_info).palette_size[uVar1] != '\0')) {
        (*visit)(xd,(int)uVar1,r);
      }
    }
  }
  return;
}

Assistant:

void av1_visit_palette(AV1Decoder *const pbi, MACROBLOCKD *const xd,
                       aom_reader *r, palette_visitor_fn_t visit) {
  if (!is_inter_block(xd->mi[0])) {
    for (int plane = 0; plane < AOMMIN(2, av1_num_planes(&pbi->common));
         ++plane) {
      if (plane == 0 || xd->is_chroma_ref) {
        if (xd->mi[0]->palette_mode_info.palette_size[plane])
          visit(xd, plane, r);
      } else {
        assert(xd->mi[0]->palette_mode_info.palette_size[plane] == 0);
      }
    }
  }
}